

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  bool bVar1;
  size_t sVar2;
  AssertionPrinter *this_local;
  
  printSourceInfo(this);
  sVar2 = Counts::total(&(this->stats->totals).assertions);
  if (sVar2 == 0) {
    std::operator<<(this->stream,"\n");
  }
  else {
    bVar1 = AssertionResult::isOk(this->result);
    if (bVar1) {
      std::operator<<(this->stream,"\n");
    }
    printResultType(this);
    printOriginalExpression(this);
    printReconstructedExpression(this);
  }
  printMessage(this);
  return;
}

Assistant:

void print() const {
				printSourceInfo();
				if (stats.totals.assertions.total() > 0) {
					if (result.isOk())
						stream << "\n";
					printResultType();
					printOriginalExpression();
					printReconstructedExpression();
				}
				else {
					stream << "\n";
				}
				printMessage();
			}